

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O0

string * __thiscall
helics::apps::zmqBrokerServer::generateResponseToMessage_abi_cxx11_
          (zmqBrokerServer *this,message_t *msg,portData *pdata,CoreType ctype)

{
  string_view message;
  byte bVar1;
  action_t aVar2;
  ActionMessage *in_RDI;
  ActionMessage rep;
  ActionMessage rxcmd;
  size_t sz;
  size_t in_stack_fffffffffffffce8;
  ActionMessage *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  char *__lhs;
  size_type in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  ActionMessage *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  ActionMessage *in_stack_fffffffffffffd38;
  allocator<char> local_2a1;
  char local_2a0 [64];
  __sv_type local_260;
  uint local_24c;
  ActionMessage local_248 [2];
  allocator<char> local_d1 [40];
  size_t local_30;
  
  local_30 = zmq::message_t::size((message_t *)in_stack_fffffffffffffcf0);
  if (local_30 < 0x19) {
    in_stack_fffffffffffffd28 = (char *)zmq::message_t::data((message_t *)in_stack_fffffffffffffcf0)
    ;
    in_stack_fffffffffffffd30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         zmq::message_t::size((message_t *)in_stack_fffffffffffffcf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00
               ,(allocator<char> *)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd20 = (ActionMessage *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (allocator<char> *)in_stack_fffffffffffffd20);
    std::operator+(in_stack_fffffffffffffcf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcf0);
    bVar1 = std::operator==(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
    if ((bVar1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (allocator<char> *)in_stack_fffffffffffffd20);
      std::operator+(in_stack_fffffffffffffcf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcf0);
      std::allocator<char>::~allocator(local_d1);
      return (string *)in_RDI;
    }
  }
  else {
    zmq::message_t::data((message_t *)in_stack_fffffffffffffcf0);
    zmq::message_t::size((message_t *)in_stack_fffffffffffffcf0);
    ActionMessage::ActionMessage
              (in_stack_fffffffffffffd20,
               (void *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (size_t)in_stack_fffffffffffffd10);
    TypedBrokerServer::generateMessageResponse
              (in_stack_fffffffffffffd38,(portData *)in_stack_fffffffffffffd30,
               (CoreType)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    aVar2 = ActionMessage::action(local_248);
    if (aVar2 != cmd_ignore) {
      ActionMessage::to_string_abi_cxx11_(in_RDI);
    }
    local_24c = (uint)(aVar2 != cmd_ignore);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffcf0);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffcf0);
    if (local_24c != 0) {
      return (string *)in_RDI;
    }
  }
  zmq::message_t::size((message_t *)in_stack_fffffffffffffcf0);
  __lhs = local_2a0;
  CLI::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcf0);
  local_260 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffcf0);
  message._M_str = (char *)in_stack_fffffffffffffcf0;
  message._M_len = in_stack_fffffffffffffce8;
  TypedBrokerServer::logMessage(message);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (allocator<char> *)in_stack_fffffffffffffd20);
  std::allocator<char>::~allocator(&local_2a1);
  return (string *)in_RDI;
}

Assistant:

std::string
    zmqBrokerServer::generateResponseToMessage(zmq::message_t& msg, portData& pdata, CoreType ctype)
{
    auto sz = msg.size();
    if (sz < 25) {
        if (std::string(static_cast<char*>(msg.data()), msg.size()) ==
            std::string("close_server:") + name_) {
            //      std::cerr << "received close server message" << std::endl;
            return std::string("close_server:") + name_;
        }
    } else {
        ActionMessage rxcmd(static_cast<char*>(msg.data()), msg.size());
        auto rep = generateMessageResponse(rxcmd, pdata, ctype);
        if (rep.action() != CMD_IGNORE) {
            return rep.to_string();
        }
    }
    logMessage("received unknown message of length " + std::to_string(msg.size()));
    return "ignored";
}